

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O2

int zstat(char **argv)

{
  FILE *__stream;
  int iVar1;
  uint uVar2;
  ulonglong uVar3;
  tm *__tp;
  undefined8 uVar4;
  zip_stat sb;
  tm tm;
  char buf [100];
  
  uVar3 = strtoull(*argv,(char **)0x0,10);
  iVar1 = zip_stat_index(za,uVar3,stat_flags,&sb);
  __stream = _stderr;
  if (iVar1 < 0) {
    uVar4 = zip_strerror(za);
    fprintf(__stream,"zip_stat_index failed on \'%lu\' failed: %s\n",uVar3,uVar4);
    iVar1 = -1;
  }
  else {
    if ((sb.valid & 1) != 0) {
      encode_filename(sb.name);
      printf("name: \'%s\'\n",filename_buffer);
    }
    if ((sb.valid & 2) != 0) {
      printf("index: \'%lu\'\n",sb.index);
    }
    if ((sb.valid & 4) != 0) {
      printf("size: \'%lu\'\n",sb.size);
    }
    if ((sb.valid & 8) != 0) {
      printf("compressed size: \'%lu\'\n",sb.comp_size);
    }
    if ((sb.valid & 0x10) != 0) {
      __tp = localtime_r(&sb.mtime,(tm *)&tm);
      if (__tp == (tm *)0x0) {
        puts("mtime: <not valid>");
      }
      else {
        strftime(buf,100,"%a %b %d %Y %H:%M:%S",__tp);
        printf("mtime: \'%s\'\n",buf);
      }
    }
    if ((sb.valid & 0x20) != 0) {
      printf("crc: \'%0x\'\n",(ulong)sb.crc);
    }
    uVar2 = (uint)sb.valid;
    if ((sb.valid & 0x40) != 0) {
      printf("compression method: \'%d\'\n",(ulong)sb.comp_method);
      uVar2 = (uint)sb.valid;
    }
    if ((char)uVar2 < '\0') {
      printf("encryption method: \'%d\'\n",(ulong)sb.encryption_method);
      uVar2 = (uint)sb.valid;
    }
    if ((uVar2 >> 8 & 1) != 0) {
      printf("flags: \'%ld\'\n",(ulong)sb.flags);
    }
    putchar(10);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
zstat(char *argv[]) {
    zip_uint64_t idx;
    char buf[100];
    struct zip_stat sb;
    idx = strtoull(argv[0], NULL, 10);

    if (zip_stat_index(za, idx, stat_flags, &sb) < 0) {
        fprintf(stderr, "zip_stat_index failed on '%" PRIu64 "' failed: %s\n", idx, zip_strerror(za));
        return -1;
    }

    if (sb.valid & ZIP_STAT_NAME)
        printf("name: '%s'\n", encode_filename(sb.name));
    if (sb.valid & ZIP_STAT_INDEX)
        printf("index: '%" PRIu64 "'\n", sb.index);
    if (sb.valid & ZIP_STAT_SIZE)
        printf("size: '%" PRIu64 "'\n", sb.size);
    if (sb.valid & ZIP_STAT_COMP_SIZE)
        printf("compressed size: '%" PRIu64 "'\n", sb.comp_size);
    if (sb.valid & ZIP_STAT_MTIME) {
        struct tm *tpm;
        struct tm tm;
        tpm = zip_localtime(&sb.mtime, &tm);
        if (tpm == NULL) {
            printf("mtime: <not valid>\n");
        }
        else {
            strftime(buf, sizeof(buf), "%a %b %d %Y %H:%M:%S", tpm);
            printf("mtime: '%s'\n", buf);
        }
    }
    if (sb.valid & ZIP_STAT_CRC)
        printf("crc: '%0x'\n", sb.crc);
    if (sb.valid & ZIP_STAT_COMP_METHOD)
        printf("compression method: '%d'\n", sb.comp_method);
    if (sb.valid & ZIP_STAT_ENCRYPTION_METHOD)
        printf("encryption method: '%d'\n", sb.encryption_method);
    if (sb.valid & ZIP_STAT_FLAGS)
        printf("flags: '%ld'\n", (long)sb.flags);
    printf("\n");

    return 0;
}